

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

float ImGui::NavUpdatePageUpPageDown(int allowed_dir_flags)

{
  ImGuiNavLayer IVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  bool bVar4;
  uint in_EDI;
  float fVar5;
  float fVar6;
  float fVar7;
  float nav_scoring_rect_offset_y;
  float page_offset_y;
  ImRect *nav_rect_rel;
  bool page_down_held;
  bool page_up_held;
  ImGuiWindow *window;
  ImGuiContext *g;
  undefined4 in_stack_ffffffffffffffbc;
  int in_stack_ffffffffffffffc0;
  ImGuiWindow *this;
  bool local_32;
  bool local_31;
  float local_30;
  
  pIVar2 = GImGui;
  if ((((GImGui->NavMoveDir == -1) && (GImGui->NavWindow != (ImGuiWindow *)0x0)) &&
      ((GImGui->NavWindow->Flags & 0x40000U) == 0)) &&
     ((GImGui->NavWindowingTarget == (ImGuiWindow *)0x0 && (GImGui->NavLayer == ImGuiNavLayer_Main))
     )) {
    this = GImGui->NavWindow;
    local_31 = IsKeyDown((GImGui->IO).KeyMap[5]);
    local_31 = local_31 && (in_EDI & 4) != 0;
    local_32 = IsKeyDown((pIVar2->IO).KeyMap[6]);
    local_32 = local_32 && (in_EDI & 8) != 0;
    if (local_31 != local_32) {
      bVar4 = SUB41((uint)in_stack_ffffffffffffffbc >> 0x18,0);
      if (((this->DC).NavLayerActiveMask != 0) || (((this->DC).NavHasScroll & 1U) == 0)) {
        IVar1 = pIVar2->NavLayer;
        fVar6 = ImRect::GetHeight(&this->InnerClipRect);
        fVar5 = ImGuiWindow::CalcFontSize(this);
        fVar7 = ImRect::GetHeight(this->NavRectRel + IVar1);
        fVar6 = ImMax<float>(0.0,-fVar5 + fVar6 + fVar7);
        local_30 = 0.0;
        bVar3 = IsKeyPressed(in_stack_ffffffffffffffc0,bVar4);
        if (bVar3) {
          pIVar2->NavMoveDir = 3;
          pIVar2->NavMoveClipDir = 2;
          pIVar2->NavMoveRequestFlags = 0x30;
          local_30 = -fVar6;
        }
        else {
          bVar4 = IsKeyPressed(in_stack_ffffffffffffffc0,bVar4);
          if (bVar4) {
            pIVar2->NavMoveDir = 2;
            pIVar2->NavMoveClipDir = 3;
            pIVar2->NavMoveRequestFlags = 0x30;
            local_30 = fVar6;
          }
        }
        return local_30;
      }
      bVar3 = IsKeyPressed(in_stack_ffffffffffffffc0,bVar4);
      if (bVar3) {
        fVar6 = (this->Scroll).y;
        fVar5 = ImRect::GetHeight(&this->InnerClipRect);
        SetWindowScrollY(this,fVar6 - fVar5);
      }
      else {
        bVar4 = IsKeyPressed(in_stack_ffffffffffffffc0,bVar4);
        if (bVar4) {
          fVar6 = (this->Scroll).y;
          fVar5 = ImRect::GetHeight(&this->InnerClipRect);
          SetWindowScrollY(this,fVar6 + fVar5);
        }
      }
    }
  }
  return 0.0;
}

Assistant:

static float ImGui::NavUpdatePageUpPageDown(int allowed_dir_flags)
{
    ImGuiContext& g = *GImGui;
    if (g.NavMoveDir == ImGuiDir_None && g.NavWindow && !(g.NavWindow->Flags & ImGuiWindowFlags_NoNavInputs) && !g.NavWindowingTarget && g.NavLayer == 0)
    {
        ImGuiWindow* window = g.NavWindow;
        bool page_up_held = IsKeyDown(g.IO.KeyMap[ImGuiKey_PageUp]) && (allowed_dir_flags & (1 << ImGuiDir_Up));
        bool page_down_held = IsKeyDown(g.IO.KeyMap[ImGuiKey_PageDown]) && (allowed_dir_flags & (1 << ImGuiDir_Down));
        if (page_up_held != page_down_held) // If either (not both) are pressed
        {
            if (window->DC.NavLayerActiveMask == 0x00 && window->DC.NavHasScroll)
            {
                // Fallback manual-scroll when window has no navigable item
                if (IsKeyPressed(g.IO.KeyMap[ImGuiKey_PageUp], true))
                    SetWindowScrollY(window, window->Scroll.y - window->InnerClipRect.GetHeight());
                else if (IsKeyPressed(g.IO.KeyMap[ImGuiKey_PageDown], true))
                    SetWindowScrollY(window, window->Scroll.y + window->InnerClipRect.GetHeight());
            }
            else
            {
                const ImRect& nav_rect_rel = window->NavRectRel[g.NavLayer];
                const float page_offset_y = ImMax(0.0f, window->InnerClipRect.GetHeight() - window->CalcFontSize() * 1.0f + nav_rect_rel.GetHeight());
                float nav_scoring_rect_offset_y = 0.0f;
                if (IsKeyPressed(g.IO.KeyMap[ImGuiKey_PageUp], true))
                {
                    nav_scoring_rect_offset_y = -page_offset_y;
                    g.NavMoveDir = ImGuiDir_Down; // Because our scoring rect is offset, we intentionally request the opposite direction (so we can always land on the last item)
                    g.NavMoveClipDir = ImGuiDir_Up;
                    g.NavMoveRequestFlags = ImGuiNavMoveFlags_AllowCurrentNavId | ImGuiNavMoveFlags_AlsoScoreVisibleSet;
                }
                else if (IsKeyPressed(g.IO.KeyMap[ImGuiKey_PageDown], true))
                {
                    nav_scoring_rect_offset_y = +page_offset_y;
                    g.NavMoveDir = ImGuiDir_Up; // Because our scoring rect is offset, we intentionally request the opposite direction (so we can always land on the last item)
                    g.NavMoveClipDir = ImGuiDir_Down;
                    g.NavMoveRequestFlags = ImGuiNavMoveFlags_AllowCurrentNavId | ImGuiNavMoveFlags_AlsoScoreVisibleSet;
                }
                return nav_scoring_rect_offset_y;
            }
        }
    }
    return 0.0f;
}